

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O2

void gost_enc_cfb(gost_ctx *ctx,byte *iv,byte *clear,byte *cipher,int blocks)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  byte cur_iv [8];
  byte gamma [8];
  undefined8 local_40;
  byte local_38 [8];
  
  local_40 = *(undefined8 *)iv;
  iVar4 = 0;
  if (blocks < 1) {
    blocks = 0;
  }
  for (; iVar4 != blocks; iVar4 = iVar4 + 1) {
    gostcrypt(ctx,(byte *)&local_40,local_38);
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      bVar1 = local_38[lVar3];
      bVar2 = clear[lVar3];
      cipher[lVar3] = bVar1 ^ bVar2;
      local_38[lVar3 + -8] = bVar1 ^ bVar2;
    }
    clear = clear + 8;
    cipher = cipher + 8;
  }
  return;
}

Assistant:

void gost_enc_cfb(gost_ctx * ctx, const byte * iv, const byte * clear,
                  byte * cipher, int blocks)
{
    byte cur_iv[8];
    byte gamma[8];
    int i, j;
    const byte *in;
    byte *out;
    memcpy(cur_iv, iv, 8);
    for (i = 0, in = clear, out = cipher; i < blocks; i++, in += 8, out += 8) {
        gostcrypt(ctx, cur_iv, gamma);
        for (j = 0; j < 8; j++) {
            cur_iv[j] = out[j] = in[j] ^ gamma[j];
        }
    }
}